

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  exception *e;
  function<std::shared_ptr<QPDFStreamFilter>_()> local_88;
  allocator<char> local_51;
  string local_50 [32];
  int local_30;
  byte local_29;
  int i;
  bool decode_specialized;
  char *outfilename;
  char *infilename;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  infilename = (char *)argv;
  argv_local._0_4_ = argc;
  whoami = (char *)QUtil::getWhoami(*argv);
  outfilename = (char *)0x0;
  _i = (char *)0x0;
  local_29 = 0;
  for (local_30 = 1; local_30 < (int)argv_local; local_30 = local_30 + 1) {
    iVar1 = strcmp(*(char **)(infilename + (long)local_30 * 8),"--decode-specialized");
    if (iVar1 == 0) {
      local_29 = 1;
    }
    else if (outfilename == (char *)0x0) {
      outfilename = *(char **)(infilename + (long)local_30 * 8);
    }
    else if (_i == (char *)0x0) {
      _i = *(char **)(infilename + (long)local_30 * 8);
    }
    else {
      usage();
    }
  }
  if ((outfilename == (char *)0x0) || (_i == (char *)0x0)) {
    usage();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"/XORDecode",&local_51);
  std::function<std::shared_ptr<QPDFStreamFilter>()>::function<main::__0,void>
            ((function<std::shared_ptr<QPDFStreamFilter>()> *)&local_88,
             (anon_class_1_0_00000001 *)((long)&e + 7));
  QPDF::registerStreamFilter(local_50,&local_88);
  std::function<std::shared_ptr<QPDFStreamFilter>_()>::~function(&local_88);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  process(outfilename,_i,(bool)(local_29 & 1));
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    char const* infilename = nullptr;
    char const* outfilename = nullptr;
    bool decode_specialized = false;
    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "--decode-specialized") == 0) {
            decode_specialized = true;
        } else if (!infilename) {
            infilename = argv[i];
        } else if (!outfilename) {
            outfilename = argv[i];
        } else {
            usage();
        }
    }
    if (!(infilename && outfilename)) {
        usage();
    }

    try {
        // Register our fictitious filter. This enables QPDFWriter to decode our streams. This is
        // not a real filter, so no real PDF reading application would be able to interpret it. This
        // is just for illustrative purposes.
        QPDF::registerStreamFilter("/XORDecode", [] { return std::make_shared<SF_XORDecode>(); });
        // Do the actual processing.
        process(infilename, outfilename, decode_specialized);
    } catch (std::exception& e) {
        std::cerr << whoami << ": exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}